

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex,
          size_t streamLength)

{
  _Rb_tree_header *p_Var1;
  StreamBlock *pSVar2;
  iterator iVar3;
  size_t local_20;
  size_t markerIndex_local;
  
  local_20 = markerIndex;
  iVar3 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>,_std::_Select1st<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
          ::find(&(this->Markers)._M_t,&local_20);
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    pSVar2 = (StreamBlock *)iVar3._M_node[1]._M_parent;
    this->pThisBlock = pSVar2;
    this->ThisPos = local_20 - pSVar2->Index;
    if (this->pSourceStream == (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0) {
      streamLength = 0;
    }
    this->LengthLeft = streamLength;
  }
  return (_Rb_tree_header *)iVar3._M_node != p_Var1;
}

Assistant:

bool BacktrackingTokenStream<Token>::BacktrackToMarker(size_t markerIndex, size_t streamLength) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;

    pThisBlock = iMap->second;
    ThisPos    = markerIndex - pThisBlock->Index;
    LengthLeft = pSourceStream ? streamLength : 0u;
    return true;
}